

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int warn_is_numeric_type(lys_type *type)

{
  LY_DATA_TYPE LVar1;
  lys_tpdf *plVar2;
  lys_tpdf *plVar3;
  int iVar4;
  lys_type *prev_type;
  int local_2c [2];
  int found;
  
  while( true ) {
    local_2c[0] = 0;
    LVar1 = *(LY_DATA_TYPE *)&((lys_tpdf *)type)->name;
    if (LVar1 - LY_TYPE_INT8 < 8) {
      return 1;
    }
    if (LVar1 == LY_TYPE_DEC64) {
      return 1;
    }
    if (LVar1 != LY_TYPE_LEAFREF) {
      if (LVar1 != LY_TYPE_UNION) {
        return 0;
      }
      prev_type = (lys_type *)0x0;
      do {
        prev_type = lyp_get_next_union_type(type,prev_type,local_2c);
        if (prev_type == (lys_type *)0x0) {
          return 0;
        }
        local_2c[0] = 0;
        iVar4 = warn_is_numeric_type(prev_type);
      } while (iVar4 == 0);
      return 1;
    }
    if (((lys_tpdf *)type)->units == (char *)0x0) break;
    type = (lys_type *)((long)((lys_tpdf *)type)->units + 0x80);
  }
  plVar2 = *(lys_tpdf **)&((lys_tpdf *)type)->flags;
  plVar3 = plVar2;
  if (plVar2 + 1 != (lys_tpdf *)type) {
    __assert_fail("&((struct lys_node_leaf *)type->parent)->type == type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0xb2f,"int warn_is_numeric_type(struct lys_type *)");
  }
  while( true ) {
    if (plVar3 == (lys_tpdf *)0x0) {
      ly_log(plVar2->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,0xb32);
      return 0;
    }
    if ((plVar3->type).base == 0x800) break;
    plVar3 = (lys_tpdf *)(plVar3->type).ext;
  }
  return 0;
}

Assistant:

static int
warn_is_numeric_type(struct lys_type *type)
{
    struct lys_node *node;
    struct lys_type *t = NULL;
    int found = 0, ret;

    switch (type->base) {
    case LY_TYPE_DEC64:
    case LY_TYPE_INT8:
    case LY_TYPE_UINT8:
    case LY_TYPE_INT16:
    case LY_TYPE_UINT16:
    case LY_TYPE_INT32:
    case LY_TYPE_UINT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT64:
        return 1;
    case LY_TYPE_UNION:
        while ((t = lyp_get_next_union_type(type, t, &found))) {
            found = 0;
            ret = warn_is_numeric_type(t);
            if (ret) {
                /* found a suitable type */
                return 1;
            }
        }
        /* did not find any suitable type */
        return 0;
    case LY_TYPE_LEAFREF:
        if (!type->info.lref.target) {
            /* we may be in a grouping (and not directly in a typedef) */
            assert(&((struct lys_node_leaf *)type->parent)->type == type);
            for (node = ((struct lys_node *)type->parent); node && (node->nodetype != LYS_GROUPING); node = node->parent);
            if (!node) {
                LOGINT(((struct lys_node *)type->parent)->module->ctx);
            }
            return 0;
        }
        return warn_is_numeric_type(&type->info.lref.target->type);
    default:
        return 0;
    }
}